

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getblockheader(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string cond;
  string cond_00;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string m_key_name_12;
  string m_key_name_13;
  string description_14;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_15;
  string description_16;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  RPCExamples examples;
  string description_17;
  string description_18;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> results_00;
  undefined4 in_stack_ffffffffffffea28;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffea2c;
  undefined8 in_stack_ffffffffffffea30;
  undefined8 in_stack_ffffffffffffea38;
  undefined8 in_stack_ffffffffffffea40;
  _Manager_type in_stack_ffffffffffffea48;
  undefined8 in_stack_ffffffffffffea50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffea58;
  pointer in_stack_ffffffffffffea68;
  pointer pRVar5;
  pointer in_stack_ffffffffffffea70;
  pointer pRVar6;
  pointer in_stack_ffffffffffffea78;
  pointer pRVar7;
  undefined8 in_stack_ffffffffffffea80;
  pointer in_stack_ffffffffffffea88;
  pointer pRVar8;
  pointer in_stack_ffffffffffffea90;
  pointer pRVar9;
  pointer in_stack_ffffffffffffea98;
  pointer pRVar10;
  undefined8 in_stack_ffffffffffffeaa0;
  pointer in_stack_ffffffffffffeaa8;
  pointer pRVar11;
  pointer in_stack_ffffffffffffeab0;
  pointer pRVar12;
  pointer in_stack_ffffffffffffeab8;
  pointer pRVar13;
  undefined8 in_stack_ffffffffffffeac0;
  pointer in_stack_ffffffffffffeac8;
  pointer pRVar14;
  pointer in_stack_ffffffffffffead0;
  pointer pRVar15;
  pointer in_stack_ffffffffffffead8;
  undefined8 in_stack_ffffffffffffeae0;
  pointer in_stack_ffffffffffffeae8;
  pointer in_stack_ffffffffffffeaf0;
  pointer in_stack_ffffffffffffeaf8;
  undefined8 in_stack_ffffffffffffeb00;
  pointer in_stack_ffffffffffffeb08;
  allocator<char> local_14da;
  allocator<char> local_14d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14d8;
  allocator<char> local_14ba;
  allocator<char> local_14b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14b8;
  allocator<char> local_149a;
  allocator<char> local_1499;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1498;
  allocator<char> local_1479;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1478;
  allocator<char> local_1459;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1458;
  allocator<char> local_143a;
  allocator<char> local_1439;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1438;
  allocator<char> local_141a;
  allocator<char> local_1419;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1418;
  allocator<char> local_13fa;
  allocator<char> local_13f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13f8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13d8;
  allocator<char> local_13ba;
  allocator<char> local_13b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13b8;
  allocator<char> local_139a;
  allocator<char> local_1399;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1398;
  allocator<char> local_137b;
  allocator<char> local_137a;
  allocator<char> local_1379;
  RPCResults local_1378;
  allocator_type local_135e;
  allocator<char> local_135d;
  bool local_135c;
  allocator<char> local_135b;
  allocator<char> local_135a;
  allocator<char> local_1359;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1358;
  allocator<char> local_133a;
  allocator<char> local_1339;
  string local_1338;
  string local_1318;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1278;
  char *local_1258;
  size_type local_1250;
  char local_1248 [8];
  undefined8 uStack_1240;
  string local_1238 [32];
  string local_1218 [32];
  string local_11f8 [32];
  string local_11d8 [32];
  string local_11b8 [32];
  string local_1198 [32];
  string local_1178 [32];
  string local_1158 [32];
  string local_1138 [32];
  string local_1118 [32];
  string local_10f8 [32];
  string local_10d8 [32];
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [8];
  undefined8 local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  string local_ff8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  RPCResult local_e18 [4];
  RPCResult local_bf8;
  RPCResult local_b70;
  RPCResult local_ae8;
  RPCResult local_a60;
  RPCResult local_9d8;
  RPCResult local_950;
  RPCResult local_8c8;
  RPCResult local_840;
  RPCResult local_7b8;
  RPCResult local_730;
  RPCResult local_6a8;
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  RPCResult local_5c0 [2];
  RPCArgOptions local_4b0;
  string local_468 [32];
  UniValue local_448;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  string local_390 [32];
  RPCArgOptions local_370;
  string local_328 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getblockheader",&local_1339);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nIf verbose is false, returns a string that is serialized, hex-encoded data for blockheader \'hash\'.\nIf verbose is true, returns an Object with information about blockheader <hash>.\n"
             ,&local_133a);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"blockhash",&local_1359);
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_328,"The block hash",&local_135a);
  local_370.oneline_description._M_dataplus._M_p = (pointer)&local_370.oneline_description.field_2;
  local_370.skip_type_check = false;
  local_370.oneline_description._M_string_length = 0;
  local_370.oneline_description.field_2._M_local_buf[0] = '\0';
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_370._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  name._M_string_length = in_stack_ffffffffffffea30;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  name.field_2._8_8_ = in_stack_ffffffffffffea40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeaa0;
  description_17._M_string_length = (size_type)in_stack_ffffffffffffeab0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeaa8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeab8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffeac0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffead0;
  opts._0_8_ = in_stack_ffffffffffffeac8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffead8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeae0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeae8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeaf0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeaf8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeb00;
  opts._64_8_ = in_stack_ffffffffffffeb08;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_17,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"verbose",&local_135b);
  local_135c = true;
  UniValue::UniValue<bool,_bool,_true>(&local_448,&local_135c);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_3f0,&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,"true for a json object, false for the hex-encoded data",&local_135d);
  local_4b0.oneline_description._M_dataplus._M_p = (pointer)&local_4b0.oneline_description.field_2;
  local_4b0.skip_type_check = false;
  local_4b0.oneline_description._M_string_length = 0;
  local_4b0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4b0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  name_00._M_string_length = in_stack_ffffffffffffea30;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  name_00.field_2._8_8_ = in_stack_ffffffffffffea40;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea50;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea58;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea68;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea70;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea78;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea80;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea90;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea98;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeaa0;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffeab0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeaa8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeab8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffeac0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffead0;
  opts_00._0_8_ = in_stack_ffffffffffffeac8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffead8;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeae0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeae8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeaf0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeaf8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeb00;
  opts_00._64_8_ = in_stack_ffffffffffffeb08;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_390,fallback_00,description_18,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1358,__l,&local_135e);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"for verbose = true",&local_1379);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"",&local_137a);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"",&local_137b);
  std::__cxx11::string::string<std::allocator<char>>(local_e38,"hash",&local_1399);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e58,"the block hash (same as provided)",&local_139a);
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name._M_string_length = in_stack_ffffffffffffea30;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffea40;
  description._M_string_length = in_stack_ffffffffffffea50;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description.field_2 = in_stack_ffffffffffffea58;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffea70;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffea68;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(local_e18,STR_HEX,m_key_name,description,inner,SUB81(local_e38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e78,"confirmations",&local_13b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e98,"The number of confirmations, or -1 if the block is not on the main chain",
             &local_13ba);
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_00._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_00._M_string_length = in_stack_ffffffffffffea50;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_00.field_2 = in_stack_ffffffffffffea58;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(local_e18 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_e78,0));
  std::__cxx11::string::string<std::allocator<char>>(local_eb8,"height",&local_13d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed8,"The block height or index",&local_13da);
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_01._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_01._M_string_length = in_stack_ffffffffffffea50;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_01.field_2 = in_stack_ffffffffffffea58;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(local_e18 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_eb8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ef8,"version",&local_13f9);
  std::__cxx11::string::string<std::allocator<char>>(local_f18,"The block version",&local_13fa);
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_02._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_02._M_string_length = in_stack_ffffffffffffea50;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_02.field_2 = in_stack_ffffffffffffea58;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(local_e18 + 3,NUM,m_key_name_02,description_02,inner_02,SUB81(local_ef8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f38,"versionHex",&local_1419);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f58,"The block version formatted in hexadecimal",&local_141a);
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_03._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_03._M_string_length = in_stack_ffffffffffffea50;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_03.field_2 = in_stack_ffffffffffffea58;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_bf8,STR_HEX,m_key_name_03,description_03,inner_03,SUB81(local_f38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f78,"merkleroot",&local_1439);
  std::__cxx11::string::string<std::allocator<char>>(local_f98,"The merkle root",&local_143a);
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_04._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_04._M_string_length = in_stack_ffffffffffffea50;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_04.field_2 = in_stack_ffffffffffffea58;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_b70,STR_HEX,m_key_name_04,description_04,inner_04,SUB81(local_f78,0));
  std::__cxx11::string::string<std::allocator<char>>(local_fb8,"time",&local_1459);
  std::operator+(&local_fd8,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_05._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_05._M_string_length = in_stack_ffffffffffffea50;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_05.field_2 = in_stack_ffffffffffffea58;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_ae8,NUM_TIME,m_key_name_05,description_05,inner_05,SUB81(local_fb8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_ff8,"mediantime",&local_1479);
  std::operator+(&local_1018,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_06._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_06._M_string_length = in_stack_ffffffffffffea50;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_06.field_2 = in_stack_ffffffffffffea58;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_a60,NUM_TIME,m_key_name_06,description_06,inner_06,SUB81(local_ff8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1038,"nonce",&local_1499);
  std::__cxx11::string::string<std::allocator<char>>(local_1058,"The nonce",&local_149a);
  local_14b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_07._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_07._M_string_length = in_stack_ffffffffffffea50;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_07.field_2 = in_stack_ffffffffffffea58;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_9d8,NUM,m_key_name_07,description_07,inner_07,SUB81(local_1038,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1078,"bits",&local_14b9);
  std::__cxx11::string::string<std::allocator<char>>(local_1098,"The bits",&local_14ba);
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_08._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_08._M_string_length = in_stack_ffffffffffffea50;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_08.field_2 = in_stack_ffffffffffffea58;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_950,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_1078,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_10b8,"difficulty",&local_14d9);
  std::__cxx11::string::string<std::allocator<char>>(local_10d8,"The difficulty",&local_14da);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_09._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_09._M_string_length = in_stack_ffffffffffffea50;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_09.field_2 = in_stack_ffffffffffffea58;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_8c8,NUM,m_key_name_09,description_09,inner_09,SUB81(local_10b8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_10f8,"chainwork",(allocator<char> *)&stack0xffffffffffffeb07);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1118,"Expected number of hashes required to produce the current chain",
             (allocator<char> *)&stack0xffffffffffffeb06);
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_10._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_10._M_string_length = in_stack_ffffffffffffea50;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_10.field_2 = in_stack_ffffffffffffea58;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_840,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_10f8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1138,"nTx",(allocator<char> *)&stack0xffffffffffffeae7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1158,"The number of transactions in the block",
             (allocator<char> *)&stack0xffffffffffffeae6);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea28;
  m_key_name_11._M_string_length = in_stack_ffffffffffffea30;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffea40;
  description_11._M_string_length = in_stack_ffffffffffffea50;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_11.field_2 = in_stack_ffffffffffffea58;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult(&local_7b8,NUM,m_key_name_11,description_11,inner_11,SUB81(local_1138,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1178,"previousblockhash",(allocator<char> *)&stack0xffffffffffffeac7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1198,"The hash of the previous block (if available)",
             (allocator<char> *)&stack0xffffffffffffeac6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffea30;
  auVar1._0_4_ = in_stack_ffffffffffffea2c;
  auVar1._12_8_ = in_stack_ffffffffffffea38;
  auVar1._20_8_ = in_stack_ffffffffffffea40;
  auVar1._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffea50;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_12.field_2 = in_stack_ffffffffffffea58;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult
            (&local_730,STR_HEX,(string)(auVar1 << 0x20),SUB81(local_1178,0),description_12,inner_12
             ,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11b8,"nextblockhash",(allocator<char> *)&stack0xffffffffffffeaa7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11d8,"The hash of the next block (if available)",
             (allocator<char> *)&stack0xffffffffffffeaa6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_8_ = in_stack_ffffffffffffea30;
  auVar2._0_4_ = in_stack_ffffffffffffea2c;
  auVar2._12_8_ = in_stack_ffffffffffffea38;
  auVar2._20_8_ = in_stack_ffffffffffffea40;
  auVar2._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffea50;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  description_13.field_2 = in_stack_ffffffffffffea58;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea70;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea68;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea78;
  RPCResult::RPCResult
            (&local_6a8,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_11b8,0),description_13,inner_13
             ,true);
  __l_00._M_len = 0xf;
  __l_00._M_array = local_e18;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1398,__l_00,(allocator_type *)&stack0xffffffffffffea87);
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  cond._M_dataplus._M_p._0_4_ = uVar4;
  cond._M_string_length = in_stack_ffffffffffffea30;
  cond.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  cond.field_2._8_8_ = in_stack_ffffffffffffea40;
  m_key_name_12._M_string_length = in_stack_ffffffffffffea50;
  m_key_name_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  m_key_name_12.field_2 = in_stack_ffffffffffffea58;
  description_15._M_string_length = (size_type)in_stack_ffffffffffffea70;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_15.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar10;
  RPCResult::RPCResult(local_5c0,cond,(Type)local_5e0,m_key_name_12,description_15,inner_14);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11f8,"for verbose=false",(allocator<char> *)&stack0xffffffffffffea86);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1218,"",(allocator<char> *)&stack0xffffffffffffea85);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1238,"A string that is serialized, hex-encoded data for block \'hash\'",
             (allocator<char> *)&stack0xffffffffffffea84);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea2c;
  cond_00._M_dataplus._M_p._0_4_ = uVar4;
  cond_00._M_string_length = in_stack_ffffffffffffea30;
  cond_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea38;
  cond_00.field_2._8_8_ = in_stack_ffffffffffffea40;
  m_key_name_13._M_string_length = in_stack_ffffffffffffea50;
  m_key_name_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea48;
  m_key_name_13.field_2 = in_stack_ffffffffffffea58;
  description_16.field_2._M_allocated_capacity = 0;
  description_16._M_dataplus._M_p = (pointer)0x0;
  description_16._M_string_length = 0;
  description_16.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar10;
  RPCResult::RPCResult(local_5c0 + 1,cond_00,(Type)local_11f8,m_key_name_13,description_16,inner_15)
  ;
  results_00._M_len = 2;
  results_00._M_array = local_5c0;
  RPCResults::RPCResults(&local_1378,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b8,"getblockheader",(allocator<char> *)&stack0xffffffffffffea67);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12d8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"",
             (allocator<char> *)&stack0xffffffffffffea66);
  HelpExampleCli(&local_1298,&local_12b8,&local_12d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1318,"getblockheader",(allocator<char> *)&stack0xffffffffffffea65);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1338,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"",
             (allocator<char> *)&stack0xffffffffffffea64);
  HelpExampleRpc(&local_12f8,&local_1318,&local_1338);
  std::operator+(&local_1278,&local_1298,&local_12f8);
  local_1258 = local_1248;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1278._M_dataplus._M_p == &local_1278.field_2) {
    uStack_1240 = local_1278.field_2._8_8_;
  }
  else {
    local_1258 = local_1278._M_dataplus._M_p;
  }
  local_1250 = local_1278._M_string_length;
  local_1278._M_string_length = 0;
  local_1278.field_2._M_local_buf[0] = '\0';
  description_14._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:566:9)>
       ::_M_invoke;
  description_14._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:566:9)>
                ::_M_manager;
  description_14.field_2 = in_stack_ffffffffffffea58;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea80;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._M_string_length = in_stack_ffffffffffffeaa0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar11;
  examples.m_examples.field_2._8_8_ = pRVar12;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffeac0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar14;
  fun._M_invoker = (_Invoker_type)pRVar15;
  local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffea30,&stack0xffffffffffffea38)),
             description_14,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffea38);
  std::__cxx11::string::~string((string *)&local_1258);
  std::__cxx11::string::~string((string *)&local_1278);
  std::__cxx11::string::~string((string *)&local_12f8);
  std::__cxx11::string::~string((string *)&local_1338);
  std::__cxx11::string::~string((string *)&local_1318);
  std::__cxx11::string::~string((string *)&local_1298);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1378.m_results);
  lVar3 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_5c0[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea68);
  std::__cxx11::string::~string(local_1238);
  std::__cxx11::string::~string(local_1218);
  std::__cxx11::string::~string(local_11f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1398);
  lVar3 = 0x770;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_e18[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea88);
  std::__cxx11::string::~string(local_11d8);
  std::__cxx11::string::~string(local_11b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeaa8);
  std::__cxx11::string::~string(local_1198);
  std::__cxx11::string::~string(local_1178);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeac8);
  std::__cxx11::string::~string(local_1158);
  std::__cxx11::string::~string(local_1138);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeae8);
  std::__cxx11::string::~string(local_1118);
  std::__cxx11::string::~string(local_10f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb08);
  std::__cxx11::string::~string(local_10d8);
  std::__cxx11::string::~string(local_10b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14d8);
  std::__cxx11::string::~string(local_1098);
  std::__cxx11::string::~string(local_1078);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14b8);
  std::__cxx11::string::~string(local_1058);
  std::__cxx11::string::~string(local_1038);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1498);
  std::__cxx11::string::~string((string *)&local_1018);
  std::__cxx11::string::~string(local_ff8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1478);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::__cxx11::string::~string(local_fb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1458);
  std::__cxx11::string::~string(local_f98);
  std::__cxx11::string::~string(local_f78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1438);
  std::__cxx11::string::~string(local_f58);
  std::__cxx11::string::~string(local_f38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1418);
  std::__cxx11::string::~string(local_f18);
  std::__cxx11::string::~string(local_ef8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13f8);
  std::__cxx11::string::~string(local_ed8);
  std::__cxx11::string::~string(local_eb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13d8);
  std::__cxx11::string::~string(local_e98);
  std::__cxx11::string::~string(local_e78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13b8);
  std::__cxx11::string::~string(local_e58);
  std::__cxx11::string::~string(local_e38);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_5e0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1358);
  lVar3 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x108;
  } while (lVar3 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_4b0);
  std::__cxx11::string::~string(local_468);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_3f0);
  UniValue::~UniValue(&local_448);
  std::__cxx11::string::~string(local_390);
  RPCArgOptions::~RPCArgOptions(&local_370);
  std::__cxx11::string::~string(local_328);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockheader()
{
    return RPCHelpMan{"getblockheader",
                "\nIf verbose is false, returns a string that is serialized, hex-encoded data for blockheader 'hash'.\n"
                "If verbose is true, returns an Object with information about blockheader <hash>.\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The block hash"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{true}, "true for a json object, false for the hex-encoded data"},
                },
                {
                    RPCResult{"for verbose = true",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "hash", "the block hash (same as provided)"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations, or -1 if the block is not on the main chain"},
                            {RPCResult::Type::NUM, "height", "The block height or index"},
                            {RPCResult::Type::NUM, "version", "The block version"},
                            {RPCResult::Type::STR_HEX, "versionHex", "The block version formatted in hexadecimal"},
                            {RPCResult::Type::STR_HEX, "merkleroot", "The merkle root"},
                            {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM, "nonce", "The nonce"},
                            {RPCResult::Type::STR_HEX, "bits", "The bits"},
                            {RPCResult::Type::NUM, "difficulty", "The difficulty"},
                            {RPCResult::Type::STR_HEX, "chainwork", "Expected number of hashes required to produce the current chain"},
                            {RPCResult::Type::NUM, "nTx", "The number of transactions in the block"},
                            {RPCResult::Type::STR_HEX, "previousblockhash", /*optional=*/true, "The hash of the previous block (if available)"},
                            {RPCResult::Type::STR_HEX, "nextblockhash", /*optional=*/true, "The hash of the next block (if available)"},
                        }},
                    RPCResult{"for verbose=false",
                        RPCResult::Type::STR_HEX, "", "A string that is serialized, hex-encoded data for block 'hash'"},
                },
                RPCExamples{
                    HelpExampleCli("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
            + HelpExampleRpc("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash(ParseHashV(request.params[0], "hash"));

    bool fVerbose = true;
    if (!request.params[1].isNull())
        fVerbose = request.params[1].get_bool();

    const CBlockIndex* pblockindex;
    const CBlockIndex* tip;
    {
        ChainstateManager& chainman = EnsureAnyChainman(request.context);
        LOCK(cs_main);
        pblockindex = chainman.m_blockman.LookupBlockIndex(hash);
        tip = chainman.ActiveChain().Tip();
    }

    if (!pblockindex) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
    }

    if (!fVerbose)
    {
        DataStream ssBlock{};
        ssBlock << pblockindex->GetBlockHeader();
        std::string strHex = HexStr(ssBlock);
        return strHex;
    }

    return blockheaderToJSON(*tip, *pblockindex);
},
    };
}